

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O2

int av1_cyclic_refresh_disable_lf_cdef(AV1_COMP *cpi)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (cpi->common).quant_params.base_qindex;
  iVar4 = 1;
  if (((((cpi->active_map).enabled == 0) ||
       ((cpi->rc).percent_blocks_inactive <= (cpi->sf).rt_sf.thresh_active_maps_skip_lf_cdef)) &&
      ((((cpi->rc).frames_since_key < 0x1f ||
        (((uVar2 = cpi->cyclic_refresh->percent_refresh, (int)uVar2 < 1 ||
          (cpi->cyclic_refresh->counter_encode_maxq_scene_change <= (int)(300 / (ulong)uVar2))) ||
         (999 < (cpi->rc).frame_source_sad)))) ||
       (iVar3 = (cpi->rc).worst_quality >> 3, SBORROW4(iVar1,iVar3 * 7) == iVar1 + iVar3 * -7 < 0)))
      ) && ((((cpi->sf).rt_sf.skip_lf_screen < 2 || ((cpi->rc).high_source_sad != 0)) ||
            ((49999 < (cpi->rc).frame_source_sad || ((cpi->rc).worst_quality <= iVar1)))))) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int av1_cyclic_refresh_disable_lf_cdef(AV1_COMP *const cpi) {
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int qindex = cpi->common.quant_params.base_qindex;
  if (cpi->active_map.enabled &&
      cpi->rc.percent_blocks_inactive >
          cpi->sf.rt_sf.thresh_active_maps_skip_lf_cdef)
    return 1;
  if (cpi->rc.frames_since_key > 30 && cr->percent_refresh > 0 &&
      cr->counter_encode_maxq_scene_change > 300 / cr->percent_refresh &&
      cpi->rc.frame_source_sad < 1000 &&
      qindex < 7 * (cpi->rc.worst_quality >> 3))
    return 1;
  // More aggressive skip.
  else if (cpi->sf.rt_sf.skip_lf_screen > 1 && !cpi->rc.high_source_sad &&
           cpi->rc.frame_source_sad < 50000 && qindex < cpi->rc.worst_quality)
    return 1;
  return 0;
}